

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O1

void __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::printTo
          (SamplingStrategyResponse *this,ostream *out)

{
  _SamplingStrategyResponse__isset _Var1;
  string local_88;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"SamplingStrategyResponse(",0x19);
  std::__ostream_insert<char,std::char_traits<char>>(out,"strategyType=",0xd);
  apache::thrift::to_string<jaegertracing::sampling_manager::thrift::SamplingStrategyType::type>
            (&local_88,&this->strategyType);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_88._M_dataplus._M_p,local_88._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"probabilisticSampling=",0x16);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::
    to_string<jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy>
              (&local_88,&this->probabilisticSampling);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_88._M_dataplus._M_p,local_88._M_string_length);
  }
  if ((((byte)_Var1 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2)) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"rateLimitingSampling=",0x15);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy>
              (&local_48,&this->rateLimitingSampling);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  }
  if ((((byte)_Var1 & 2) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"operationSampling=",0x12);
  _Var1 = this->__isset;
  if (((byte)_Var1 & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::
    to_string<jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies>
              (&local_68,&this->operationSampling);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_68._M_dataplus._M_p,local_68._M_string_length);
  }
  if ((((byte)_Var1 & 4) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2)) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void SamplingStrategyResponse::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "SamplingStrategyResponse(";
  out << "strategyType=" << to_string(strategyType);
  out << ", " << "probabilisticSampling="; (__isset.probabilisticSampling ? (out << to_string(probabilisticSampling)) : (out << "<null>"));
  out << ", " << "rateLimitingSampling="; (__isset.rateLimitingSampling ? (out << to_string(rateLimitingSampling)) : (out << "<null>"));
  out << ", " << "operationSampling="; (__isset.operationSampling ? (out << to_string(operationSampling)) : (out << "<null>"));
  out << ")";
}